

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,PhysicalOperatorType *args_1,
          unsigned_long *args_2,unsigned_long *args_3)

{
  PhysicalOperator *pPVar1;
  PhysicalColumnDataScan *in_RCX;
  ArenaAllocator *in_RDI;
  vector<duckdb::LogicalType,_true> *in_R8;
  PhysicalColumnDataScan *ptr;
  data_ptr_t mem;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff78;
  PhysicalColumnDataScan *__uref;
  idx_t in_stack_ffffffffffffffc0;
  idx_t in_stack_ffffffffffffffc8;
  PhysicalOperator *pPVar2;
  
  pPVar1 = (PhysicalOperator *)
           ArenaAllocator::AllocateAligned(in_RDI,(idx_t)in_stack_ffffffffffffff78);
  pPVar2 = pPVar1;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_RDI,in_stack_ffffffffffffff78);
  PhysicalColumnDataScan::PhysicalColumnDataScan
            (in_RCX,in_R8,(PhysicalOperatorType)((ulong)pPVar2 >> 0x38),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x77aa50);
  __uref = (PhysicalColumnDataScan *)(in_RDI + 1);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalColumnDataScan&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)in_RDI,__uref);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               *)in_RDI,(value_type *)__uref);
  return pPVar1;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}